

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_string_ops.hpp
# Opt level: O0

vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
* gmlc::utilities::
  generalized_section_splitting<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
            (basic_string_view<char,_std::char_traits<char>_> *line,
            basic_string_view<char,_std::char_traits<char>_> *delimiterCharacters,
            basic_string_view<char,_std::char_traits<char>_> *sectionStartCharacters,
            CharMapper<unsigned_char> *sectionMatch,bool compress)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  basic_string_view<char,_std::char_traits<char>_> __str_02;
  basic_string_view<char,_std::char_traits<char>_> __str_03;
  basic_string_view<char,_std::char_traits<char>_> __str_04;
  basic_string_view<char,_std::char_traits<char>_> *pbVar1;
  size_t sVar2;
  basic_string_view<char,_std::char_traits<char>_> *pbVar3;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *in_RDI;
  byte in_R9B;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  size_t endLoc;
  size_type start;
  size_type d1;
  size_type sectionLoc;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *strVec;
  char *in_stack_fffffffffffffe38;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe40;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe48;
  undefined6 in_stack_fffffffffffffe50;
  char in_stack_fffffffffffffe56;
  char in_stack_fffffffffffffe57;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe58;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe60;
  undefined8 in_stack_fffffffffffffef8;
  undefined1 compress_00;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff00;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff08;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  basic_string_view<char,_std::char_traits<char>_> *local_80;
  undefined8 local_68;
  undefined8 local_60;
  basic_string_view<char,_std::char_traits<char>_> *local_58;
  undefined1 local_49;
  undefined8 local_48;
  undefined8 local_40;
  basic_string_view<char,_std::char_traits<char>_> *local_38;
  byte local_29;
  undefined8 *local_18;
  basic_string_view<char,_std::char_traits<char>_> *local_10;
  
  compress_00 = (undefined1)((ulong)in_stack_fffffffffffffef8 >> 0x38);
  local_29 = in_R9B & 1;
  local_48 = *in_RCX;
  local_40 = in_RCX[1];
  __str._M_str._0_6_ = in_stack_fffffffffffffe50;
  __str._M_len = (size_t)in_stack_fffffffffffffe48;
  __str._M_str._6_1_ = in_stack_fffffffffffffe56;
  __str._M_str._7_1_ = in_stack_fffffffffffffe57;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_38 = (basic_string_view<char,_std::char_traits<char>_> *)
             CLI::std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                       (in_stack_fffffffffffffe40,__str,(size_type)in_stack_fffffffffffffe38);
  if (local_38 == (basic_string_view<char,_std::char_traits<char>_> *)0xffffffffffffffff) {
    generalized_string_split<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
              (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,(bool)compress_00);
  }
  else {
    local_49 = 0;
    CLI::std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)0x782374);
    local_68 = *local_18;
    local_60 = local_18[1];
    __str_00._M_str._0_6_ = in_stack_fffffffffffffe50;
    __str_00._M_len = (size_t)in_stack_fffffffffffffe48;
    __str_00._M_str._6_1_ = in_stack_fffffffffffffe56;
    __str_00._M_str._7_1_ = in_stack_fffffffffffffe57;
    local_58 = (basic_string_view<char,_std::char_traits<char>_> *)
               CLI::std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                         (in_stack_fffffffffffffe40,__str_00,(size_type)in_stack_fffffffffffffe38);
    bVar5._M_str = in_stack_fffffffffffffe38;
    bVar5._M_len = (size_t)in_stack_fffffffffffffe40;
    if (local_58 == (basic_string_view<char,_std::char_traits<char>_> *)0xffffffffffffffff) {
      std::
      vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::emplace_back<std::basic_string_view<char,std::char_traits<char>>const&>
                ((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)CONCAT17(in_stack_fffffffffffffe57,
                             CONCAT16(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50)),
                 in_stack_fffffffffffffe48);
    }
    else {
      local_80 = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
      while (pbVar3 = local_80,
            pbVar1 = (basic_string_view<char,_std::char_traits<char>_> *)
                     std::basic_string_view<char,_std::char_traits<char>_>::length(local_10),
            pbVar3 < pbVar1) {
        if (local_58 < local_38) {
          if (local_80 == local_58) {
            if ((local_29 & 1) == 0) {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_90);
              std::
              vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ::push_back((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           *)bVar5._M_len,(value_type *)bVar5._M_str);
            }
          }
          else {
            std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (in_stack_fffffffffffffe60,(size_type)in_stack_fffffffffffffe58,
                       CONCAT17(in_stack_fffffffffffffe57,
                                CONCAT16(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50)));
            std::
            vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
            ::emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                      ((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffe57,
                                   CONCAT16(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50)),
                       in_stack_fffffffffffffe48);
          }
          local_80 = (basic_string_view<char,_std::char_traits<char>_> *)
                     ((long)&local_58->_M_len + 1);
          __str_01._M_str._0_6_ = in_stack_fffffffffffffe50;
          __str_01._M_len = (size_t)in_stack_fffffffffffffe48;
          __str_01._M_str._6_1_ = in_stack_fffffffffffffe56;
          __str_01._M_str._7_1_ = in_stack_fffffffffffffe57;
          local_58 = (basic_string_view<char,_std::char_traits<char>_> *)
                     CLI::std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                               ((basic_string_view<char,_std::char_traits<char>_> *)bVar5._M_len,
                                __str_01,(size_type)bVar5._M_str);
        }
        else {
          std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                    (local_10,(size_type)local_38);
          std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                    (local_10,(size_type)local_38);
          CharMapper<unsigned_char>::operator[]
                    ((CharMapper<unsigned_char> *)bVar5._M_len,bVar5._M_str._7_1_);
          sVar2 = getChunkEnd<std::basic_string_view<char,std::char_traits<char>>>
                            ((size_t)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                             in_stack_fffffffffffffe57,in_stack_fffffffffffffe56);
          if (sVar2 == 0xffffffffffffffff) {
            bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                              (in_stack_fffffffffffffe60,(size_type)in_stack_fffffffffffffe58,
                               CONCAT17(in_stack_fffffffffffffe57,
                                        CONCAT16(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50
                                                )));
            in_stack_fffffffffffffe58 =
                 (basic_string_view<char,_std::char_traits<char>_> *)bVar4._M_len;
            in_stack_fffffffffffffe50 = bVar4._M_str._0_6_;
            in_stack_fffffffffffffe56 = bVar4._M_str._6_1_;
            in_stack_fffffffffffffe57 = bVar4._M_str._7_1_;
            std::
            vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
            ::emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                      ((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        *)bVar4._M_str,in_stack_fffffffffffffe48);
            local_80 = (basic_string_view<char,_std::char_traits<char>_> *)
                       std::basic_string_view<char,_std::char_traits<char>_>::length(local_10);
          }
          else {
            __str_02._M_str._0_6_ = in_stack_fffffffffffffe50;
            __str_02._M_len = (size_t)in_stack_fffffffffffffe48;
            __str_02._M_str._6_1_ = in_stack_fffffffffffffe56;
            __str_02._M_str._7_1_ = in_stack_fffffffffffffe57;
            local_58 = (basic_string_view<char,_std::char_traits<char>_> *)
                       CLI::std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                                 ((basic_string_view<char,_std::char_traits<char>_> *)bVar5._M_len,
                                  __str_02,(size_type)bVar5._M_str);
            if (local_58 == (basic_string_view<char,_std::char_traits<char>_> *)0xffffffffffffffff)
            {
              std::basic_string_view<char,_std::char_traits<char>_>::substr
                        (in_stack_fffffffffffffe60,(size_type)in_stack_fffffffffffffe58,
                         CONCAT17(in_stack_fffffffffffffe57,
                                  CONCAT16(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50)));
              std::
              vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
              ::emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                        ((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          *)CONCAT17(in_stack_fffffffffffffe57,
                                     CONCAT16(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50)),
                         in_stack_fffffffffffffe48);
              local_38 = local_58;
              local_80 = local_58;
            }
            else {
              bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                                (in_stack_fffffffffffffe60,(size_type)in_stack_fffffffffffffe58,
                                 CONCAT17(in_stack_fffffffffffffe57,
                                          CONCAT16(in_stack_fffffffffffffe56,
                                                   in_stack_fffffffffffffe50)));
              in_stack_fffffffffffffe60 =
                   (basic_string_view<char,_std::char_traits<char>_> *)bVar4._M_str;
              std::
              vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
              ::emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                        ((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          *)CONCAT17(in_stack_fffffffffffffe57,
                                     CONCAT16(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50)),
                         in_stack_fffffffffffffe48);
              __str_03._M_str._0_6_ = in_stack_fffffffffffffe50;
              __str_03._M_len = (size_t)in_stack_fffffffffffffe48;
              __str_03._M_str._6_1_ = in_stack_fffffffffffffe56;
              __str_03._M_str._7_1_ = in_stack_fffffffffffffe57;
              local_38 = (basic_string_view<char,_std::char_traits<char>_> *)
                         CLI::std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                                   ((basic_string_view<char,_std::char_traits<char>_> *)bVar5._M_len
                                    ,__str_03,(size_type)bVar5._M_str);
              local_80 = (basic_string_view<char,_std::char_traits<char>_> *)
                         ((long)&local_58->_M_len + 1);
            }
            __str_04._M_str._0_6_ = in_stack_fffffffffffffe50;
            __str_04._M_len = (size_t)in_stack_fffffffffffffe48;
            __str_04._M_str._6_1_ = in_stack_fffffffffffffe56;
            __str_04._M_str._7_1_ = in_stack_fffffffffffffe57;
            local_58 = (basic_string_view<char,_std::char_traits<char>_> *)
                       CLI::std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                                 ((basic_string_view<char,_std::char_traits<char>_> *)bVar5._M_len,
                                  __str_04,(size_type)bVar5._M_str);
          }
        }
        if ((local_58 == (basic_string_view<char,_std::char_traits<char>_> *)0xffffffffffffffff) &&
           (local_80 != (basic_string_view<char,_std::char_traits<char>_> *)0xffffffffffffffff)) {
          in_stack_fffffffffffffe48 = local_80;
          pbVar3 = (basic_string_view<char,_std::char_traits<char>_> *)
                   std::basic_string_view<char,_std::char_traits<char>_>::length(local_10);
          if ((in_stack_fffffffffffffe48 < pbVar3) || ((local_29 & 1) == 0)) {
            bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                              (in_stack_fffffffffffffe60,(size_type)in_stack_fffffffffffffe58,
                               CONCAT17(in_stack_fffffffffffffe57,
                                        CONCAT16(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50
                                                )));
            std::
            vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
            ::emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                      ((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffe57,
                                   CONCAT16(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50)),
                       in_stack_fffffffffffffe48);
          }
          local_80 = local_58;
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

std::vector<XO> generalized_section_splitting(
    const X& line,
    const X& delimiterCharacters,
    const X& sectionStartCharacters,
    const utilities::CharMapper<unsigned char>& sectionMatch,
    bool compress)
{
    auto sectionLoc = line.find_first_of(sectionStartCharacters);

    if (sectionLoc == X::npos) {
        return generalized_string_split<X, XO>(
            line, delimiterCharacters, compress);
    }
    std::vector<XO> strVec;

    auto d1 = line.find_first_of(delimiterCharacters);
    if (d1 == X::npos)  // there are no delimiters
    {
        strVec.emplace_back(line);
        return strVec;
    }
    decltype(sectionLoc) start = 0;

    while (start < line.length()) {
        if (sectionLoc > d1) {
            if (start == d1) {
                if (!compress) {
                    strVec.push_back(XO{});
                }
            } else {
                strVec.emplace_back(line.substr(start, d1 - start));
            }
            start = d1 + 1;
            d1 = line.find_first_of(delimiterCharacters, start);
        } else {
            // now we are in a quote
            auto endLoc = getChunkEnd(
                sectionLoc + 1,
                line,
                line[sectionLoc],
                sectionMatch[line[sectionLoc]]);
            if (endLoc != X::npos) {
                d1 = line.find_first_of(delimiterCharacters, endLoc + 1);
                if (d1 == X::npos) {
                    strVec.emplace_back(line.substr(start));
                    sectionLoc = d1;
                    start = d1;
                } else {
                    strVec.emplace_back(line.substr(start, d1 - start));
                    sectionLoc =
                        line.find_first_of(sectionStartCharacters, d1 + 1);
                    start = d1 + 1;
                }
                d1 = line.find_first_of(delimiterCharacters, start);
            } else {
                strVec.emplace_back(line.substr(start));
                start = line.length();
            }
        }
        // get the last string
        if (d1 == X::npos) {
            if (start != X::npos) {
                if ((start < line.length()) || (!compress)) {
                    strVec.emplace_back(line.substr(start));
                }
                start = d1;
            }
        }
    }
    return strVec;
}